

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

MoveList * megumax::get_pv(MoveList *__return_storage_ptr__,UCTNode *node,int max_length)

{
  uint uVar1;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *pvVar2;
  reference this;
  Move *pMVar3;
  int iVar4;
  
  libchess::MoveList::MoveList(__return_storage_ptr__);
  iVar4 = 0;
  while( true ) {
    pvVar2 = UCTNode::children(node);
    if (((pvVar2->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)._M_impl.
         super__Vector_impl_data._M_start ==
         (pvVar2->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)._M_impl.
         super__Vector_impl_data._M_finish) || (max_length <= iVar4)) break;
    pvVar2 = UCTNode::children(node);
    uVar1 = select_most_visited_child_index(pvVar2);
    pvVar2 = UCTNode::children(node);
    this = std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::at(pvVar2,(ulong)uVar1)
    ;
    pMVar3 = UCTNode::move(this);
    libchess::MoveList::add(__return_storage_ptr__,(Move)pMVar3->value_);
    pvVar2 = UCTNode::children(node);
    node = std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::at(pvVar2,(ulong)uVar1)
    ;
    iVar4 = iVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

MoveList get_pv(UCTNode* node, const int max_length = 8) {
    MoveList move_list;
    int ply = 0;
    while (!node->children().empty() && ply < max_length) {
        const auto idx = select_most_visited_child_index(node->children());
        move_list.add(node->children().at(idx).move());
        node = &node->children().at(idx);
        ply++;
    }
    return move_list;
}